

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_instance.c
# Opt level: O1

apx_portInstance_t * apx_nodeInstance_find_port_by_name(apx_nodeInstance_t *self,char *name)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  apx_portInstance_t *unaff_R15;
  apx_portInstance_t *paVar6;
  
  if (name != (char *)0x0 && self != (apx_nodeInstance_t *)0x0) {
    if ((self->num_provide_ports != 0) && (self->num_provide_ports != 0)) {
      lVar5 = 0;
      uVar4 = 0;
      paVar6 = unaff_R15;
      do {
        unaff_R15 = (apx_portInstance_t *)((long)&self->provide_ports->pack_program + lVar5);
        pcVar3 = apx_portInstance_name(unaff_R15);
        if ((pcVar3 == (char *)0x0) || (iVar2 = strcmp(pcVar3,name), iVar2 != 0)) {
          bVar1 = true;
          unaff_R15 = paVar6;
        }
        else {
          bVar1 = false;
        }
        if (!bVar1) {
          bVar1 = false;
          goto LAB_0012f9a2;
        }
        uVar4 = uVar4 + 1;
        lVar5 = lVar5 + 0x58;
        paVar6 = unaff_R15;
      } while (uVar4 < self->num_provide_ports);
    }
    bVar1 = true;
    if ((self->num_require_ports != 0) && (self->num_require_ports != 0)) {
      lVar5 = 0;
      uVar4 = 0;
      paVar6 = unaff_R15;
      do {
        unaff_R15 = (apx_portInstance_t *)((long)&self->require_ports->pack_program + lVar5);
        pcVar3 = apx_portInstance_name(unaff_R15);
        if ((pcVar3 == (char *)0x0) || (iVar2 = strcmp(pcVar3,name), iVar2 != 0)) {
          bVar1 = true;
          unaff_R15 = paVar6;
        }
        else {
          bVar1 = false;
        }
        if (!bVar1) break;
        uVar4 = uVar4 + 1;
        lVar5 = lVar5 + 0x58;
        paVar6 = unaff_R15;
      } while (uVar4 < self->num_require_ports);
    }
LAB_0012f9a2:
    if (!bVar1) {
      return unaff_R15;
    }
  }
  return (apx_portInstance_t *)0x0;
}

Assistant:

apx_portInstance_t* apx_nodeInstance_find_port_by_name(apx_nodeInstance_t const* self, char const* name)
{
   if ((self != NULL) && (name != NULL))
   {
      apx_size_t port_id;
      if (self->num_provide_ports > 0)
      {
         for (port_id = 0u; port_id < self->num_provide_ports; port_id++)
         {
            apx_portInstance_t* port_instance = &self->provide_ports[port_id];
            char const* port_name = apx_portInstance_name(port_instance);
            if ((port_name != NULL) && (strcmp(port_name, name) == 0))
            {
               return port_instance;
            }
         }
      }
      if (self->num_require_ports > 0)
      {
         for (port_id = 0u; port_id < self->num_require_ports; port_id++)
         {
            apx_portInstance_t* port_instance = &self->require_ports[port_id];
            char const* port_name = apx_portInstance_name(port_instance);
            if ((port_name != NULL) && (strcmp(port_name, name) == 0))
            {
               return port_instance;
            }
         }
      }
   }
   return NULL;
}